

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::TriaO1::Global(MatrixXd *__return_storage_ptr__,TriaO1 *this,MatrixXd *local)

{
  Index IVar1;
  MatrixXd *xpr;
  Matrix<double,__1,_3,_0,__1,_3> *pMVar2;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pPVar3;
  scalar_sum_op<double,_double> local_7d9;
  MatrixXd *local_7d8;
  Matrix<double,__1,_3,_0,__1,_3> *local_7d0;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_7c8;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_7c0;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_7b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_7b0;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_750;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> local_718;
  Matrix<double,__1,_3,_0,__1,_3> *pMStack_700;
  long local_6f8;
  long lStack_6f0;
  Index local_6e8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_6e0;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> local_6a8;
  Matrix<double,__1,_3,_0,__1,_3> *pMStack_690;
  long local_688;
  long lStack_680;
  Index local_678;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_670;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_638;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> local_600;
  Matrix<double,__1,_3,_0,__1,_3> *pMStack_5e8;
  long local_5e0;
  long lStack_5d8;
  Index local_5d0;
  Rhs local_5c8;
  Rhs local_558;
  Lhs local_4e8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>
  local_408;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>
  local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_d8;
  
  local_7d0 = &this->coords_;
  local_7c8 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase(&local_600,
          (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_data,(this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
                 m_storage.m_rows,1);
  local_5e0 = 0;
  lStack_5d8 = 0;
  local_5d0 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
              m_storage.m_rows;
  local_7d8 = local;
  local_7b8.m_expression = local;
  pMStack_5e8 = &this->coords_;
  Eigen::
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>::
  Block(&local_638,&local_7b8,0);
  local_408.m_lhs.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
       (PointerType)0x3ff0000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                    *)&local_2b0,1,
                   local_638.
                   super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                   .m_cols.m_value,(scalar_constant_op<double> *)&local_408);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
  ::CwiseBinaryOp(&local_7b0,(Lhs *)&local_2b0,&local_638,
                  (scalar_difference_op<double,_double> *)&local_4e8);
  local_7c0.m_expression = local;
  Eigen::
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>::
  Block(&local_670,&local_7c0,1);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
  ::CwiseBinaryOp(&local_d8,&local_7b0,&local_670,(scalar_difference_op<double,_double> *)&local_2b0
                 );
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
  .m_data = local_d8.m_lhs.m_rhs.
            super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
            .m_data;
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
  ._8_8_ = local_d8.m_lhs.m_rhs.
           super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
           ._8_8_;
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
  .m_cols.m_value =
       local_d8.m_lhs.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
       .m_cols.m_value;
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_xpr.m_expression =
       local_d8.m_lhs.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_xpr.m_expression;
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_startRow.m_value =
       local_d8.m_lhs.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_startRow.m_value;
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_startCol.m_value =
       local_d8.m_lhs.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_startCol.m_value;
  local_4e8.m_rhs.m_expression.m_lhs.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_outerStride =
       local_d8.m_lhs.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_outerStride;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
       local_600.m_data;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_rows.
  m_value = local_600.m_rows.m_value;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>._16_8_ =
       local_600._16_8_;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr =
       pMStack_5e8;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = local_5e0;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = lStack_5d8;
  local_4e8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  m_outerStride = local_5d0;
  local_4e8.m_rhs.m_expression.m_lhs.m_lhs.m_cols.m_value = local_d8.m_lhs.m_lhs.m_cols.m_value;
  local_4e8.m_rhs.m_expression.m_lhs.m_lhs.m_functor.m_other =
       local_d8.m_lhs.m_lhs.m_functor.m_other;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
  .m_data = local_d8.m_rhs.
            super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
            .m_data;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
  ._8_8_ = local_d8.m_rhs.
           super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
           ._8_8_;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
  .m_cols.m_value =
       local_d8.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
       .m_cols.m_value;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_xpr.m_expression =
       local_d8.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_xpr.m_expression;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_startRow.m_value =
       local_d8.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_startRow.m_value;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_startCol.m_value =
       local_d8.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_startCol.m_value;
  local_4e8.m_rhs.m_expression.m_rhs.
  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
  .m_outerStride =
       local_d8.m_rhs.
       super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
       .m_outerStride;
  IVar1 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase(&local_6a8,
          (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_data + IVar1,IVar1,1);
  pMVar2 = local_7d0;
  xpr = local_7d8;
  pMStack_690 = local_7d0;
  local_688 = 0;
  lStack_680 = 1;
  local_678 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
              m_storage.m_rows;
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_6e0,local_7d8,0);
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  m_outerStride = local_678;
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = local_688;
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = lStack_680;
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>._16_8_ =
       local_6a8._16_8_;
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr =
       pMStack_690;
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
       local_6a8.m_data;
  local_558.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_rows.
  m_value = local_6a8.m_rows.m_value;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = local_6e0.
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
           .m_data;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>._8_8_
       = local_6e0.
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
         ._8_8_;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_cols.m_value =
       local_6e0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
       m_cols.m_value;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
       local_6e0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_xpr;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  m_startRow.m_value =
       local_6e0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_startRow.m_value;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  m_startCol.m_value =
       local_6e0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_startCol.m_value;
  local_558.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  m_outerStride =
       local_6e0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_outerStride;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>_>
  ::CwiseBinaryOp(&local_408,&local_4e8,&local_558,(scalar_sum_op<double,_double> *)&local_2b0);
  IVar1 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase(&local_718,
          (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_data + IVar1 * 2,IVar1,1);
  pMStack_700 = pMVar2;
  local_6f8 = 0;
  lStack_6f0 = 2;
  local_6e8 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
              m_storage.m_rows;
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_750,xpr,1);
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  m_outerStride = local_6e8;
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = local_6f8;
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = lStack_6f0;
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>._16_8_ =
       local_718._16_8_;
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr =
       pMStack_700;
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
       local_718.m_data;
  local_5c8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_rows.
  m_value = local_718.m_rows.m_value;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = local_750.
           super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
           .m_data;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>._8_8_
       = local_750.
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
         ._8_8_;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_cols.m_value =
       local_750.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
       m_cols.m_value;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
       local_750.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_xpr;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  m_startRow.m_value =
       local_750.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_startRow.m_value;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  m_startCol.m_value =
       local_750.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_startCol.m_value;
  local_5c8.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  m_outerStride =
       local_750.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       m_outerStride;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>_>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>_>
  ::CwiseBinaryOp(&local_2b0,&local_408,&local_5c8,&local_7d9);
  pPVar3 = local_7c8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const>,0>const,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>,0>const>const,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>,0>const>>
            (local_7c8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>_>_>
              *)&local_2b0);
  return (MatrixXd *)pPVar3;
}

Assistant:

Eigen::MatrixXd TriaO1::Global(const Eigen::MatrixXd& local) const {
  return coords_.col(0) *
             (1 - local.array().row(0) - local.array().row(1)).matrix() +
         coords_.col(1) * local.row(0) + coords_.col(2) * local.row(1);
}